

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraData.cpp
# Opt level: O1

void __thiscall
ExtraData::parseVT_ERROR
          (ExtraData *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *val,int from,int to)

{
  longlong errorType;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_28,val);
  errorType = Utils::vectEightBytesToUnsignedInt(&local_28,from);
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ExtraDataUtils::parseError(errorType);
  return;
}

Assistant:

void ExtraData::parseVT_ERROR(std::vector<unsigned int> val, int from, int to) {
    long long int errorVal = Utils::vectEightBytesToUnsignedInt(val, from);
    ExtraDataUtils::parseError(errorVal );
}